

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

void __thiscall
QGraphicsLinearLayout::setStretchFactor
          (QGraphicsLinearLayout *this,QGraphicsLayoutItem *item,int stretch)

{
  int iVar1;
  QGraphicsLinearLayoutPrivate *item_00;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QGraphicsLinearLayoutPrivate *d;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  item_00 = d_func((QGraphicsLinearLayout *)0x9b76c3);
  if (in_RSI == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),(char *)item_00,
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (local_28,
               "QGraphicsLinearLayout::setStretchFactor: cannot assign a stretch factor to a null item"
              );
  }
  else {
    iVar1 = stretchFactor((QGraphicsLinearLayout *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
                          (QGraphicsLayoutItem *)item_00);
    if (iVar1 != in_EDX) {
      QGraphicsGridLayoutEngine::setStretchFactor
                ((QGraphicsGridLayoutEngine *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
                 (QGraphicsLayoutItem *)item_00,(int)((ulong)in_RDI >> 0x20),(Orientation)in_RDI);
      (**(code **)(*in_RDI + 0x38))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsLinearLayout::setStretchFactor(QGraphicsLayoutItem *item, int stretch)
{
    Q_D(QGraphicsLinearLayout);
    if (!item) {
        qWarning("QGraphicsLinearLayout::setStretchFactor: cannot assign"
                 " a stretch factor to a null item");
        return;
    }
    if (stretchFactor(item) == stretch)
        return;
    d->engine.setStretchFactor(item, stretch, d->orientation);
    invalidate();
}